

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcSubedge::IfcSubedge(IfcSubedge *this)

{
  IfcSubedge *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x58,"IfcSubedge");
  IfcEdge::IfcEdge(&this->super_IfcEdge,&PTR_construction_vtable_24__00fec6b8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSubedge,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcSubedge,_1UL> *)
             &(this->super_IfcEdge).field_0x40,&PTR_construction_vtable_24__00fec730);
  (this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xfec600;
  *(undefined8 *)&this->field_0x58 = 0xfec6a0;
  *(undefined8 *)
   &(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xfec628;
  *(undefined8 *)
   &(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xfec650;
  *(undefined8 *)&(this->super_IfcEdge).field_0x40 = 0xfec678;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcEdge>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcEdge> *)&(this->super_IfcEdge).field_0x50,
             (LazyObject *)0x0);
  return;
}

Assistant:

IfcSubedge() : Object("IfcSubedge") {}